

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void init_motion_estimation(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  long *in_RDI;
  bool bVar3;
  SEARCH_METHODS i_1;
  int level;
  SEARCH_METHODS i;
  int should_update;
  int fpf_y_stride;
  int y_stride_src;
  int y_stride;
  int aligned_width;
  MotionVectorSearchParams *mv_search_params;
  AV1_COMMON *cm;
  int local_3c;
  byte local_35;
  byte local_2d;
  
  iVar1 = aom_calc_y_stride((int)in_RDI[0x77f7] + 7U & 0xfffffff8,*(int *)((long)in_RDI + 0x42724));
  local_3c = iVar1;
  if ((((int)in_RDI[0x8467] == (int)in_RDI[0x77f7]) &&
      (*(int *)((long)in_RDI + 0x4233c) == *(int *)((long)in_RDI + 0x3bfbc))) &&
     (iVar2 = av1_superres_scaled((AV1_COMMON *)(in_RDI + 0x77f0)), iVar2 == 0)) {
    local_3c = *(int *)(*(long *)(*(long *)(*in_RDI + 0x170) + 0x28) + 0x20);
  }
  bVar3 = true;
  if ((*(int *)((long)in_RDI + 0x61a6c) != 0) &&
     (bVar3 = true, *(int *)((long)in_RDI + 0x67144) != 0)) {
    bVar3 = iVar1 != *(int *)((long)in_RDI + 0x61a6c);
  }
  if (bVar3) {
    for (local_2d = 0; local_2d < 7; local_2d = local_2d + 1) {
      iVar2 = SUB14(local_2d == 2 || local_2d == 3,0);
      (*av1_init_motion_compensation[local_2d])
                ((search_site_config *)(in_RDI + (ulong)local_2d * 0x18d + 0xc1c1),iVar1,iVar2);
      (*av1_init_motion_compensation[local_2d])
                ((search_site_config *)(in_RDI + (ulong)local_2d * 0x18d + 0xcc9c),local_3c,iVar2);
    }
    av1_init_motion_fpf(_fpf_y_stride,should_update);
    for (local_35 = 1; local_35 < 7; local_35 = local_35 + 1) {
      memcpy(in_RDI + (ulong)local_35 * 0x18d + 0xd777,in_RDI + 0xd777,0xc68);
    }
  }
  return;
}

Assistant:

static void init_motion_estimation(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MotionVectorSearchParams *const mv_search_params = &cpi->mv_search_params;
  const int aligned_width = (cm->width + 7) & ~7;
  const int y_stride =
      aom_calc_y_stride(aligned_width, cpi->oxcf.border_in_pixels);
  const int y_stride_src = ((cpi->oxcf.frm_dim_cfg.width != cm->width ||
                             cpi->oxcf.frm_dim_cfg.height != cm->height) ||
                            av1_superres_scaled(cm))
                               ? y_stride
                               : cpi->ppi->lookahead->buf->img.y_stride;
  int fpf_y_stride =
      cm->cur_frame != NULL ? cm->cur_frame->buf.y_stride : y_stride;

  // Update if search_site_cfg is uninitialized or the current frame has a new
  // stride
  const int should_update =
      !mv_search_params->search_site_cfg[SS_CFG_SRC][DIAMOND].stride ||
      !mv_search_params->search_site_cfg[SS_CFG_LOOKAHEAD][DIAMOND].stride ||
      (y_stride !=
       mv_search_params->search_site_cfg[SS_CFG_SRC][DIAMOND].stride);

  if (!should_update) {
    return;
  }

  // Initialization of search_site_cfg for NUM_DISTINCT_SEARCH_METHODS.
  for (SEARCH_METHODS i = DIAMOND; i < NUM_DISTINCT_SEARCH_METHODS; i++) {
    const int level = ((i == NSTEP_8PT) || (i == CLAMPED_DIAMOND)) ? 1 : 0;
    av1_init_motion_compensation[i](
        &mv_search_params->search_site_cfg[SS_CFG_SRC][i], y_stride, level);
    av1_init_motion_compensation[i](
        &mv_search_params->search_site_cfg[SS_CFG_LOOKAHEAD][i], y_stride_src,
        level);
  }

  // First pass search site config initialization.
  av1_init_motion_fpf(&mv_search_params->search_site_cfg[SS_CFG_FPF][DIAMOND],
                      fpf_y_stride);
  for (SEARCH_METHODS i = NSTEP; i < NUM_DISTINCT_SEARCH_METHODS; i++) {
    memcpy(&mv_search_params->search_site_cfg[SS_CFG_FPF][i],
           &mv_search_params->search_site_cfg[SS_CFG_FPF][DIAMOND],
           sizeof(search_site_config));
  }
}